

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O3

_Bool move_next(hdr_iter *iter)

{
  int iVar1;
  hdr_histogram *phVar2;
  uint uVar3;
  int iVar4;
  char cVar5;
  byte bVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  
  uVar8 = iter->counts_index + 1;
  iter->counts_index = uVar8;
  phVar2 = iter->h;
  iVar1 = phVar2->counts_len;
  if ((int)uVar8 < iVar1) {
    uVar3 = uVar8;
    if (phVar2->normalizing_index_offset != 0) {
      iVar10 = uVar8 - phVar2->normalizing_index_offset;
      iVar4 = 0;
      if (iVar1 <= iVar10) {
        iVar4 = -iVar1;
      }
      if (iVar10 < 0) {
        iVar4 = iVar1;
      }
      uVar3 = iVar4 + iVar10;
    }
    lVar9 = phVar2->counts[(int)uVar3];
    iter->count = lVar9;
    iter->cumulative_count = iter->cumulative_count + lVar9;
    iVar4 = phVar2->sub_bucket_half_count;
    bVar6 = (byte)phVar2->sub_bucket_half_count_magnitude;
    iVar10 = (int)uVar8 >> (bVar6 & 0x1f);
    cVar5 = (char)iVar10 + -1;
    uVar3 = iVar4 - 1;
    if (iVar10 < 1) {
      cVar5 = '\0';
      iVar4 = 0;
    }
    uVar11 = (long)(int)(iVar4 + (uVar3 & uVar8)) << (cVar5 + (char)phVar2->unit_magnitude & 0x3fU);
    uVar7 = phVar2->sub_bucket_mask | uVar11;
    lVar9 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar9 == 0; lVar9 = lVar9 + -1) {
      }
    }
    bVar6 = 0x3f - (((byte)lVar9 ^ 0x3f) + bVar6);
    iVar4 = (int)((long)uVar11 >> (bVar6 & 0x3f));
    lVar12 = (long)iVar4 << (bVar6 & 0x3f);
    lVar9 = 1L << ((phVar2->sub_bucket_count <= iVar4) + bVar6 & 0x3f);
    iter->lowest_equivalent_value = lVar12;
    iter->value = uVar11;
    iter->highest_equivalent_value = lVar12 + lVar9 + -1;
    iter->median_equivalent_value = (lVar9 >> 1) + lVar12;
  }
  return (int)uVar8 < iVar1;
}

Assistant:

static bool move_next(struct hdr_iter* iter)
{
    iter->counts_index++;

    if (!has_buckets(iter))
    {
        return false;
    }

    iter->count = counts_get_normalised(iter->h, iter->counts_index);
    iter->cumulative_count += iter->count;
    const int64_t value = hdr_value_at_index(iter->h, iter->counts_index);
    const int32_t bucket_index = get_bucket_index(iter->h, value);
    const int32_t sub_bucket_index = get_sub_bucket_index(value, bucket_index, iter->h->unit_magnitude);
    const int64_t leq = lowest_equivalent_value_given_bucket_indices(iter->h, bucket_index, sub_bucket_index);
    const int64_t size_of_equivalent_value_range = size_of_equivalent_value_range_given_bucket_indices(
        iter->h, bucket_index, sub_bucket_index);
    iter->lowest_equivalent_value = leq;
    iter->value = value;
    iter->highest_equivalent_value = leq + size_of_equivalent_value_range - 1;
    iter->median_equivalent_value = leq + (size_of_equivalent_value_range >> 1);

    return true;
}